

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O3

int simplify_comp_quest(comp_quest_t *q,uint32 n_phone)

{
  uint uVar1;
  uint32 *puVar2;
  int iVar3;
  ulong uVar4;
  
  if (q->sum_len == 0) {
    iVar3 = 0;
  }
  else {
    puVar2 = q->prod_len;
    uVar4 = 0;
    iVar3 = 0;
    do {
      uVar1 = simplify_conj(q->conj_q[uVar4],puVar2[uVar4],n_phone);
      puVar2 = q->prod_len;
      if (uVar1 < puVar2[uVar4]) {
        puVar2[uVar4] = uVar1;
        iVar3 = 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < q->sum_len);
  }
  return iVar3;
}

Assistant:

int
simplify_comp_quest(comp_quest_t *q,
		    uint32 n_phone)
{
    int i;
    int ret = FALSE;
    int prod_len;

    for (i = 0; i < q->sum_len; i++) {
	prod_len = simplify_conj(q->conj_q[i], q->prod_len[i], n_phone);
	if (prod_len < q->prod_len[i]) {
	    assert(!(prod_len > q->prod_len[i]));
	    
	    q->prod_len[i] = prod_len;

	    ret = TRUE;
	}
    }

    /* TRUE if there is at least one term in the composite
     * question that was simplified */
    return ret;
}